

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_large_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  Byte *local_a0;
  z_stream d_stream;
  int err;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  uLong comprLen_local;
  Byte *compr_local;
  
  strcpy((char *)uncompr,"garbage");
  d_stream.state = (internal_state *)zalloc;
  d_stream.zalloc = (alloc_func)zfree;
  d_stream.zfree = (free_func)0x0;
  d_stream.next_in._0_4_ = (undefined4)comprLen;
  local_a0 = compr;
  d_stream.reserved._4_4_ = inflateInit_(&local_a0,"1.2.11",0x70);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateInit",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  while( true ) {
    d_stream.reserved._4_4_ = 0;
    d_stream.next_out._0_4_ = (undefined4)uncomprLen;
    d_stream.total_in = (uLong)uncompr;
    d_stream.reserved._4_4_ = inflate(&local_a0,0);
    if (d_stream.reserved._4_4_ == 1) break;
    if (d_stream.reserved._4_4_ != 0) {
      fprintf(_stderr,"%s error: %d\n","large inflate",(ulong)d_stream.reserved._4_4_);
      exit(1);
    }
  }
  d_stream.reserved._4_4_ = inflateEnd(&local_a0);
  if (d_stream.reserved._4_4_ != 0) {
    fprintf(_stderr,"%s error: %d\n","inflateEnd",(ulong)d_stream.reserved._4_4_);
    exit(1);
  }
  if (d_stream._32_8_ == uncomprLen * 2 + (comprLen >> 1)) {
    printf("large_inflate(): OK\n");
    return;
  }
  fprintf(_stderr,"bad large inflate: %ld\n",d_stream._32_8_);
  exit(1);
}

Assistant:

void test_large_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    for (;;) {
        d_stream.next_out = uncompr;            /* discard the output */
        d_stream.avail_out = (uInt)uncomprLen;
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        CHECK_ERR(err, "large inflate");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (d_stream.total_out != 2*uncomprLen + comprLen/2) {
        fprintf(stderr, "bad large inflate: %ld\n", d_stream.total_out);
        exit(1);
    } else {
        printf("large_inflate(): OK\n");
    }
}